

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O3

void jsons_print_choice(lyout *out,lys_node *node,int *first)

{
  char *label;
  char *val;
  lys_module *plVar1;
  
  label = node->name;
  val = jsons_nodetype_str(node->nodetype);
  jsons_print_object(out,label,"nodetype",val,0,first);
  plVar1 = lys_main_module(node->module);
  ly_print(out,",\"module\":\"%s\"",plVar1->name);
  if ((node->module->field_0x40 & 1) != 0) {
    ly_print(out,",\"included-from\":\"%s\"",node->module->name);
  }
  jsons_print_text(out,"description","text",node->dsc,1,(int *)0x0);
  jsons_print_text(out,"reference","text",node->ref,1,(int *)0x0);
  jsons_print_config(out,node->flags,(int *)0x0);
  jsons_print_status(out,node->flags,(int *)0x0);
  jsons_print_mand(out,node->flags,(int *)0x0);
  if ((char **)node[1].name != (char **)0x0) {
    jsons_print_defaults(out,(char **)node[1].name,'\x01',(int *)0x0);
  }
  jsons_print_iffeatures(out,node->module,node->iffeature,node->iffeature_size,(int *)0x0);
  jsons_print_when(out,*(lys_when **)node->hash,(int *)0x0);
  jsons_print_data(out,node->module,node->child,(int *)0x0);
  ly_print(out,"}");
  return;
}

Assistant:

static void
jsons_print_choice(struct lyout *out, const struct lys_node *node, int *first)
{
    struct lys_node_choice *choice = (struct lys_node_choice *)node;

    jsons_print_object(out, node->name, "nodetype", jsons_nodetype_str(node->nodetype), 0, first);
    ly_print(out, ",\"module\":\"%s\"", lys_main_module(node->module)->name);
    if (node->module->type) {
        ly_print(out, ",\"included-from\":\"%s\"", node->module->name);
    }
    jsons_print_text(out, "description", "text", choice->dsc, 1, NULL);
    jsons_print_text(out, "reference", "text", choice->ref, 1, NULL);
    jsons_print_config(out, choice->flags, NULL);
    jsons_print_status(out, choice->flags, NULL);
    jsons_print_mand(out, choice->flags, NULL);
    if (choice->dflt) {
        jsons_print_defaults(out, &choice->dflt->name, 1, NULL);
    }
    jsons_print_iffeatures(out, choice->module, choice->iffeature, choice->iffeature_size, NULL);
    jsons_print_when(out, choice->when, NULL);

    jsons_print_data(out, choice->module, choice->child, NULL);
    ly_print(out, "}");
}